

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QMessageBox::setInformativeText(QMessageBox *this,QString *text)

{
  QMessageBoxPrivate *this_00;
  TextInteractionFlags flags;
  TextFormat format;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_01;
  QStyle *pQVar1;
  QAnyStringView QVar2;
  
  this_00 = *(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  this_01 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this_00->informativeLabel;
  if ((text->d).size == 0) {
    if ((QWidget *)this_01.m_data != (QWidget *)0x0) {
      QWidget::hide((QWidget *)this_01.m_data);
      QObject::deleteLater();
    }
    this_00->informativeLabel = (QLabel *)0x0;
  }
  else {
    if ((QWidget *)this_01.m_data == (QWidget *)0x0) {
      this_01.m_data = operator_new(0x28);
      QLabel::QLabel((QLabel *)this_01.m_data,(QWidget *)0x0,(WindowFlags)0x0);
      QVar2.m_size = (size_t)"qt_msgbox_informativelabel";
      QVar2.field_0.m_data = this_01.m_data;
      QObject::setObjectName(QVar2);
      pQVar1 = QWidget::style((QWidget *)this);
      flags.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
      super_QFlagsStorage<Qt::TextInteractionFlag>.i =
           (QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)
           (**(code **)(*(long *)pQVar1 + 0xf0))(pQVar1,0x46,0,this,0);
      QLabel::setTextInteractionFlags((QLabel *)this_01.m_data,flags);
      QLabel::setAlignment((QLabel *)this_01.m_data,(Alignment)0x21);
      QLabel::setOpenExternalLinks((QLabel *)this_01.m_data,true);
      QLabel::setWordWrap((QLabel *)this_01.m_data,true);
      format = QLabel::textFormat(this_00->label);
      QLabel::setTextFormat((QLabel *)this_01.m_data,format);
      this_00->informativeLabel = (QLabel *)this_01;
    }
    QLabel::setText((QLabel *)this_01.m_data,text);
  }
  QMessageBoxPrivate::setupLayout(this_00);
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }